

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_extension_operator.cpp
# Opt level: O2

void __thiscall
duckdb::LogicalExtensionOperator::Serialize(LogicalExtensionOperator *this,Serializer *serializer)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  LogicalOperator::Serialize(&this->super_LogicalOperator,serializer);
  (*(this->super_LogicalOperator)._vptr_LogicalOperator[0x11])(&bStack_38,this);
  Serializer::WriteProperty<std::__cxx11::string>(serializer,200,"extension_name",&bStack_38);
  ::std::__cxx11::string::~string((string *)&bStack_38);
  return;
}

Assistant:

void LogicalExtensionOperator::Serialize(Serializer &serializer) const {
	LogicalOperator::Serialize(serializer);
	serializer.WriteProperty(200, "extension_name", GetExtensionName());
}